

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_protochain(compiler_state_t *cstate,int v,int proto,int dir)

{
  slist *psVar1;
  int iVar2;
  slist *p;
  block *b0;
  block *b1;
  undefined4 *puVar3;
  undefined4 *puVar4;
  slist *psVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  char *fmt;
  slist **__s;
  ulong uVar10;
  slist *s [100];
  block *local_360;
  slist *local_358 [101];
  
  iVar2 = alloc_reg(cstate);
  __s = local_358;
  memset(__s,0,800);
  if ((proto == 0x11) || (proto == 2)) {
    if ((cstate->off_linkpl).is_variable != 0) {
      fmt = "\'protochain\' not supported with variable length headers";
      goto LAB_0010e4b9;
    }
    cstate->no_optimize = 1;
    local_358[0] = (slist *)newchunk(cstate,0x28);
    (local_358[0]->s).code = 0;
    if (proto == 0x11) {
      local_360 = gen_linktype(cstate,0x86dd);
      local_358[1] = (slist *)newchunk(cstate,0x28);
      (local_358[1]->s).code = 0x30;
      (local_358[1]->s).k = (cstate->off_linkpl).constant_part + 6 + cstate->off_nl;
      local_358[2] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[2] = 1;
      iVar7 = 0x28;
    }
    else {
      if (proto != 2) {
        fmt = "unsupported proto to gen_protochain";
        goto LAB_0010e4b9;
      }
      local_360 = gen_linktype(cstate,0x800);
      local_358[1] = (slist *)newchunk(cstate,0x28);
      (local_358[1]->s).code = 0x30;
      (local_358[1]->s).k = (cstate->off_linkpl).constant_part + 9 + cstate->off_nl;
      local_358[2] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[2] = 0xb1;
      iVar7 = cstate->off_nl + (cstate->off_linkpl).constant_part;
    }
    *(int *)((long)local_358[2] + 0x18) = iVar7;
    local_358[3] = (slist *)newchunk(cstate,0x28);
    *(undefined4 *)local_358[3] = 0x15;
    *(int *)((long)local_358[3] + 0x18) = v;
    lVar9 = 0;
    *(undefined8 *)((long)local_358[3] + 8) = 0;
    *(undefined8 *)((long)local_358[3] + 0x10) = 0;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 0x15;
    *(undefined8 *)(puVar3 + 2) = 0;
    *(undefined8 *)(puVar3 + 4) = 0;
    puVar3[6] = 0x3b;
    *(undefined4 **)((long)local_358[3] + 0x10) = puVar3;
    local_358[4] = (slist *)puVar3;
    puVar4 = (undefined4 *)newchunk(cstate,0x28);
    local_358[5] = (slist *)puVar4;
    if (proto == 0x11) {
      __s = local_358 + 8;
      *puVar4 = 0x15;
      *(undefined8 *)(puVar4 + 2) = 0;
      *(undefined8 *)(puVar4 + 4) = 0;
      puVar4[6] = 0;
      *(undefined4 **)((long)local_358[4] + 0x10) = puVar4;
      puVar3 = (undefined4 *)newchunk(cstate,0x28);
      *puVar3 = 0x15;
      *(undefined4 **)(puVar4 + 4) = puVar3;
      *(undefined8 *)(puVar3 + 2) = 0;
      *(undefined8 *)(puVar3 + 4) = 0;
      puVar3[6] = 0x3c;
      local_358[6] = (slist *)puVar3;
      puVar4 = (undefined4 *)newchunk(cstate,0x28);
      *puVar4 = 0x15;
      *(undefined4 **)(puVar3 + 4) = puVar4;
      *(undefined8 *)(puVar4 + 2) = 0;
      *(undefined8 *)(puVar4 + 4) = 0;
      puVar4[6] = 0x2b;
      local_358[7] = (slist *)puVar4;
      local_358[8] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[8] = 0x15;
      *(slist **)(puVar4 + 4) = local_358[8];
      *(undefined8 *)((long)local_358[8] + 8) = 0;
      *(undefined8 *)((long)local_358[8] + 0x10) = 0;
      *(undefined4 *)((long)local_358[8] + 0x18) = 0x2c;
      local_358[9] = (slist *)newchunk(cstate,0x28);
      (local_358[9]->s).code = 0x50;
      (local_358[9]->s).k = cstate->off_nl + (cstate->off_linkpl).constant_part;
      local_358[10] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[10] = 2;
      *(int *)((long)local_358[10] + 0x18) = iVar2;
      local_358[0xb] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[0xb] = 0x50;
      *(u_int *)((long)local_358[0xb] + 0x18) =
           (cstate->off_linkpl).constant_part + 1 + cstate->off_nl;
      local_358[0xc] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[0xc] = 4;
      *(undefined4 *)((long)local_358[0xc] + 0x18) = 1;
      local_358[0xd] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[0xd] = 0x24;
      *(undefined4 *)((long)local_358[0xd] + 0x18) = 8;
      local_358[0xe] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[0xe] = 0xc;
      *(undefined4 *)((long)local_358[0xe] + 0x18) = 0;
      local_358[0xf] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[0xf] = 7;
      puVar3 = (undefined4 *)newchunk(cstate,0x28);
      *puVar3 = 0x60;
      puVar3[6] = iVar2;
      local_358[0x10] = (slist *)puVar3;
      local_358[0x11] = (slist *)newchunk(cstate,0x28);
      *(undefined4 *)local_358[0x11] = 5;
      *(undefined4 *)((long)local_358[0x11] + 0x18) = 0xfffffff1;
      *(slist **)(puVar3 + 4) = local_358[0x11];
      do {
        (local_358[lVar9 + 5]->s).jt = local_358[9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      uVar8 = 0x12;
    }
    else {
      *puVar4 = 4;
      puVar4[6] = 0;
      *(undefined4 **)(puVar3 + 4) = puVar4;
      uVar8 = 6;
    }
    psVar5 = (slist *)newchunk(cstate,0x28);
    (psVar5->s).code = 0x15;
    local_358[uVar8] = psVar5;
    (psVar5->s).jt = (slist *)0x0;
    (local_358[uVar8]->s).jf = (slist *)0x0;
    psVar5 = local_358[uVar8];
    (psVar5->s).k = 0x33;
    if (proto == 0x11) {
      ((*__s)->s).jf = psVar5;
    }
    psVar5 = (slist *)newchunk(cstate,0x28);
    (psVar5->s).code = 0x87;
    local_358[(ulong)uVar8 + 1] = psVar5;
    uVar6 = (ulong)(uVar8 * 8);
    *(slist **)(*(long *)((long)local_358 + uVar6) + 8) = psVar5;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 0x50;
    *(undefined4 **)((long)local_358 + uVar6 + 0x10) = puVar3;
    puVar3[6] = cstate->off_nl + (cstate->off_linkpl).constant_part;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 2;
    *(undefined4 **)((long)local_358 + uVar6 + 0x18) = puVar3;
    puVar3[6] = iVar2;
    puVar4 = (undefined4 *)newchunk(cstate,0x28);
    *puVar4 = 0x87;
    *(undefined4 **)((long)local_358 + uVar6 + 0x20) = puVar4;
    *(undefined4 **)(puVar3 + 2) = puVar4;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 4;
    *(undefined4 **)((long)local_358 + uVar6 + 0x28) = puVar3;
    puVar3[6] = 1;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 7;
    *(undefined4 **)((long)local_358 + uVar6 + 0x30) = puVar3;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 0x50;
    *(undefined4 **)((long)local_358 + uVar6 + 0x38) = puVar3;
    puVar3[6] = cstate->off_nl + (cstate->off_linkpl).constant_part;
    psVar5 = (slist *)newchunk(cstate,0x28);
    (psVar5->s).code = 4;
    local_358[(ulong)uVar8 + 8] = psVar5;
    (psVar5->s).k = 2;
    psVar5 = (slist *)newchunk(cstate,0x28);
    (psVar5->s).code = 0x24;
    local_358[(ulong)uVar8 + 9] = psVar5;
    (psVar5->s).k = 4;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 7;
    *(undefined4 **)((long)local_358 + uVar6 + 0x50) = puVar3;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 0x60;
    *(undefined4 **)((long)local_358 + uVar6 + 0x58) = puVar3;
    puVar3[6] = iVar2;
    puVar3 = (undefined4 *)newchunk(cstate,0x28);
    *puVar3 = 5;
    *(undefined4 **)((long)local_358 + uVar6 + 0x60) = puVar3;
    puVar3[6] = -10 - uVar8;
    uVar10 = (ulong)(uVar8 + 0xd);
    psVar5 = (slist *)newchunk(cstate,0x28);
    (psVar5->s).code = 4;
    local_358[uVar10] = psVar5;
    (psVar5->s).k = 0;
    *(slist **)((long)local_358[4] + 8) = psVar5;
    psVar5 = local_358[uVar10];
    *(slist **)(*(long *)((long)local_358 + uVar6) + 0x10) = psVar5;
    *(slist **)((long)local_358[3] + 8) = psVar5;
    uVar6 = 0;
    psVar5 = local_358[0];
    do {
      psVar1 = local_358[uVar6 + 1];
      uVar6 = uVar6 + 1;
      psVar5->next = psVar1;
      psVar5 = psVar1;
    } while (uVar10 != uVar6);
    local_358[uVar10]->next = (slist *)0x0;
    b1 = (block *)newchunk(cstate,0x120);
    (b1->s).code = 0x15;
    b1->head = b1;
    b1->stmts = local_358[1];
    (b1->s).k = v;
    cstate->regused[iVar2] = 0;
    gen_and(local_360,b1);
  }
  else {
    if (proto != 0) {
      fmt = "bad protocol applied for \'protochain\'";
LAB_0010e4b9:
      bpf_error(cstate,fmt);
    }
    b0 = gen_protochain(cstate,v,2,dir);
    b1 = gen_protochain(cstate,v,0x11,dir);
    gen_or(b0,b1);
  }
  return b1;
}

Assistant:

static struct block *
gen_protochain(compiler_state_t *cstate, int v, int proto, int dir)
{
#ifdef NO_PROTOCHAIN
	return gen_proto(cstate, v, proto, dir);
#else
	struct block *b0, *b;
	struct slist *s[100];
	int fix2, fix3, fix4, fix5;
	int ahcheck, again, end;
	int i, max;
	int reg2 = alloc_reg(cstate);

	memset(s, 0, sizeof(s));
	fix3 = fix4 = fix5 = 0;

	switch (proto) {
	case Q_IP:
	case Q_IPV6:
		break;
	case Q_DEFAULT:
		b0 = gen_protochain(cstate, v, Q_IP, dir);
		b = gen_protochain(cstate, v, Q_IPV6, dir);
		gen_or(b0, b);
		return b;
	default:
		bpf_error(cstate, "bad protocol applied for 'protochain'");
		/*NOTREACHED*/
	}

	/*
	 * We don't handle variable-length prefixes before the link-layer
	 * header, or variable-length link-layer headers, here yet.
	 * We might want to add BPF instructions to do the protochain
	 * work, to simplify that and, on platforms that have a BPF
	 * interpreter with the new instructions, let the filtering
	 * be done in the kernel.  (We already require a modified BPF
	 * engine to do the protochain stuff, to support backward
	 * branches, and backward branch support is unlikely to appear
	 * in kernel BPF engines.)
	 */
	if (cstate->off_linkpl.is_variable)
		bpf_error(cstate, "'protochain' not supported with variable length headers");

	cstate->no_optimize = 1; /*this code is not compatible with optimzer yet */

	/*
	 * s[0] is a dummy entry to protect other BPF insn from damage
	 * by s[fix] = foo with uninitialized variable "fix".  It is somewhat
	 * hard to find interdependency made by jump table fixup.
	 */
	i = 0;
	s[i] = new_stmt(cstate, 0);	/*dummy*/
	i++;

	switch (proto) {
	case Q_IP:
		b0 = gen_linktype(cstate, ETHERTYPE_IP);

		/* A = ip->ip_p */
		s[i] = new_stmt(cstate, BPF_LD|BPF_ABS|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 9;
		i++;
		/* X = ip->ip_hl << 2 */
		s[i] = new_stmt(cstate, BPF_LDX|BPF_MSH|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		i++;
		break;

	case Q_IPV6:
		b0 = gen_linktype(cstate, ETHERTYPE_IPV6);

		/* A = ip6->ip_nxt */
		s[i] = new_stmt(cstate, BPF_LD|BPF_ABS|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 6;
		i++;
		/* X = sizeof(struct ip6_hdr) */
		s[i] = new_stmt(cstate, BPF_LDX|BPF_IMM);
		s[i]->s.k = 40;
		i++;
		break;

	default:
		bpf_error(cstate, "unsupported proto to gen_protochain");
		/*NOTREACHED*/
	}

	/* again: if (A == v) goto end; else fall through; */
	again = i;
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.k = v;
	s[i]->s.jt = NULL;		/*later*/
	s[i]->s.jf = NULL;		/*update in next stmt*/
	fix5 = i;
	i++;

#ifndef IPPROTO_NONE
#define IPPROTO_NONE	59
#endif
	/* if (A == IPPROTO_NONE) goto end */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.jt = NULL;	/*later*/
	s[i]->s.jf = NULL;	/*update in next stmt*/
	s[i]->s.k = IPPROTO_NONE;
	s[fix5]->s.jf = s[i];
	fix2 = i;
	i++;

	if (proto == Q_IPV6) {
		int v6start, v6end, v6advance, j;

		v6start = i;
		/* if (A == IPPROTO_HOPOPTS) goto v6advance */
		s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_HOPOPTS;
		s[fix2]->s.jf = s[i];
		i++;
		/* if (A == IPPROTO_DSTOPTS) goto v6advance */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_DSTOPTS;
		i++;
		/* if (A == IPPROTO_ROUTING) goto v6advance */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_ROUTING;
		i++;
		/* if (A == IPPROTO_FRAGMENT) goto v6advance; else goto ahcheck; */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*later*/
		s[i]->s.k = IPPROTO_FRAGMENT;
		fix3 = i;
		v6end = i;
		i++;

		/* v6advance: */
		v6advance = i;

		/*
		 * in short,
		 * A = P[X + packet head];
		 * X = X + (P[X + packet head + 1] + 1) * 8;
		 */
		/* A = P[X + packet head] */
		s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		i++;
		/* MEM[reg2] = A */
		s[i] = new_stmt(cstate, BPF_ST);
		s[i]->s.k = reg2;
		i++;
		/* A = P[X + packet head + 1]; */
		s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 1;
		i++;
		/* A += 1 */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
		s[i]->s.k = 1;
		i++;
		/* A *= 8 */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_MUL|BPF_K);
		s[i]->s.k = 8;
		i++;
		/* A += X */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X);
		s[i]->s.k = 0;
		i++;
		/* X = A; */
		s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
		i++;
		/* A = MEM[reg2] */
		s[i] = new_stmt(cstate, BPF_LD|BPF_MEM);
		s[i]->s.k = reg2;
		i++;

		/* goto again; (must use BPF_JA for backward jump) */
		s[i] = new_stmt(cstate, BPF_JMP|BPF_JA);
		s[i]->s.k = again - i - 1;
		s[i - 1]->s.jf = s[i];
		i++;

		/* fixup */
		for (j = v6start; j <= v6end; j++)
			s[j]->s.jt = s[v6advance];
	} else {
		/* nop */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
		s[i]->s.k = 0;
		s[fix2]->s.jf = s[i];
		i++;
	}

	/* ahcheck: */
	ahcheck = i;
	/* if (A == IPPROTO_AH) then fall through; else goto end; */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.jt = NULL;	/*later*/
	s[i]->s.jf = NULL;	/*later*/
	s[i]->s.k = IPPROTO_AH;
	if (fix3)
		s[fix3]->s.jf = s[ahcheck];
	fix4 = i;
	i++;

	/*
	 * in short,
	 * A = P[X];
	 * X = X + (P[X + 1] + 2) * 4;
	 */
	/* A = X */
	s[i - 1]->s.jt = s[i] = new_stmt(cstate, BPF_MISC|BPF_TXA);
	i++;
	/* A = P[X + packet head]; */
	s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
	s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	i++;
	/* MEM[reg2] = A */
	s[i] = new_stmt(cstate, BPF_ST);
	s[i]->s.k = reg2;
	i++;
	/* A = X */
	s[i - 1]->s.jt = s[i] = new_stmt(cstate, BPF_MISC|BPF_TXA);
	i++;
	/* A += 1 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 1;
	i++;
	/* X = A */
	s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
	i++;
	/* A = P[X + packet head] */
	s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
	s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	i++;
	/* A += 2 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 2;
	i++;
	/* A *= 4 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_MUL|BPF_K);
	s[i]->s.k = 4;
	i++;
	/* X = A; */
	s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
	i++;
	/* A = MEM[reg2] */
	s[i] = new_stmt(cstate, BPF_LD|BPF_MEM);
	s[i]->s.k = reg2;
	i++;

	/* goto again; (must use BPF_JA for backward jump) */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JA);
	s[i]->s.k = again - i - 1;
	i++;

	/* end: nop */
	end = i;
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 0;
	s[fix2]->s.jt = s[end];
	s[fix4]->s.jf = s[end];
	s[fix5]->s.jt = s[end];
	i++;

	/*
	 * make slist chain
	 */
	max = i;
	for (i = 0; i < max - 1; i++)
		s[i]->next = s[i + 1];
	s[max - 1]->next = NULL;

	/*
	 * emit final check
	 */
	b = new_block(cstate, JMP(BPF_JEQ));
	b->stmts = s[1];	/*remember, s[0] is dummy*/
	b->s.k = v;

	free_reg(cstate, reg2);

	gen_and(b0, b);
	return b;
#endif
}